

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O2

void ft_smooth_lcd_spans(int y,int count,FT_Span *spans,TOrigin *target)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  unsigned_short uVar4;
  bool bVar5;
  
  puVar2 = target->origin;
  iVar1 = target->pitch;
  while (bVar5 = count != 0, count = count + -1, bVar5) {
    puVar3 = puVar2 + ((long)spans->x * 3 - (long)y * (long)iVar1);
    uVar4 = spans->len;
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      *puVar3 = spans->coverage;
      puVar3 = puVar3 + 3;
    }
    spans = spans + 1;
  }
  return;
}

Assistant:

static void
  ft_smooth_lcd_spans( int             y,
                       int             count,
                       const FT_Span*  spans,
                       TOrigin*        target )
  {
    unsigned char*  dst_line = target->origin - y * target->pitch;
    unsigned char*  dst;
    unsigned short  w;


    for ( ; count--; spans++ )
      for ( dst = dst_line + spans->x * 3, w = spans->len; w--; dst += 3 )
        *dst = spans->coverage;
  }